

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::Dispose_<kj::HashMap<int,_kj::String>::Entry>::destruct(void *ptr)

{
  void *ptr_local;
  
  dtor<kj::HashMap<int,kj::String>::Entry>((StringPtr *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }